

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O1

void __thiscall KDReports::Test::testMargins(Test *this)

{
  QStringView QVar1;
  QStringView QVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  longlong __tmp;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  char *local_b8;
  double local_b0;
  qreal bottom;
  QChar *pQStack_a0;
  qsizetype local_98;
  Report report;
  qreal left;
  QChar *local_60;
  qsizetype local_58;
  QFile file;
  qreal top;
  QChar *pQStack_38;
  qsizetype local_30;
  qreal right;
  storage_type_conflict *local_20;
  
  bottom = (qreal)anon_var_dwarf_f3fb;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&left,(char **)&bottom);
  QVar6.m_data = (storage_type *)left;
  QVar6.m_size = (qsizetype)&top;
  QString::fromUtf8(QVar6);
  _report = (Data *)top;
  top = 0.0;
  pQStack_38 = (QChar *)0x0;
  local_30 = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&top);
  QFile::QFile(&file,(QString *)&report);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
  bVar3 = (bool)QFile::open(&file,1);
  cVar4 = QTest::qVerify(bVar3,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x58);
  if (cVar4 != '\0') {
    KDReports::Report::Report(&report,(QObject *)0x0);
    bVar3 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar4 = QTest::qVerify(bVar3,"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x5a);
    if (cVar4 != '\0') {
      KDReports::Report::mainTextDocument();
      iVar5 = QTextDocument::blockCount();
      cVar4 = QTest::qCompare(iVar5,2,"doc.blockCount()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0x5c);
      if (cVar4 != '\0') {
        QTextDocument::toPlainText();
        local_b8 = "Title\nTest used by XmlParser.cpp";
        QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&right,&local_b8);
        QVar7.m_data = (storage_type *)right;
        QVar7.m_size = (qsizetype)&top;
        QString::fromUtf8(QVar7);
        bottom = top;
        pQStack_a0 = pQStack_38;
        top = 0.0;
        pQStack_38 = (QChar *)0x0;
        local_98 = local_30;
        local_30 = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&top);
        QStringView::QStringView<QChar,_true>((QStringView *)&top,local_60,local_58);
        QStringView::QStringView<QChar,_true>((QStringView *)&right,pQStack_a0,local_98);
        QVar1.m_data = &pQStack_38->ucs;
        QVar1.m_size = (qsizetype)top;
        QVar2.m_data = local_20;
        QVar2.m_size = (qsizetype)right;
        cVar4 = QTest::qCompare(QVar1,QVar2,"doc.toPlainText()",
                                "QString(\"Title\\nTest used by XmlParser.cpp\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0x5d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bottom);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&left);
        if (cVar4 != '\0') {
          KDReports::Report::getMargins((double *)&report,&top,&left,&bottom);
          local_b8 = (char *)top;
          local_b0 = 40.0;
          cVar4 = QTest::qCompare((double *)&local_b8,&local_b0,"static_cast<double>(top)","40.0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,99);
          if (cVar4 != '\0') {
            local_b8 = (char *)left;
            local_b0 = 0.0;
            cVar4 = QTest::qCompare((double *)&local_b8,&local_b0,"static_cast<double>(left)","0.0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                    ,100);
            if (cVar4 != '\0') {
              local_b8 = (char *)right;
              local_b0 = 20.0;
              cVar4 = QTest::qCompare((double *)&local_b8,&local_b0,"static_cast<double>(right)",
                                      "20.0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                      ,0x65);
              if (cVar4 != '\0') {
                local_b8 = (char *)bottom;
                local_b0 = 20.0;
                QTest::qCompare((double *)&local_b8,&local_b0,"static_cast<double>(bottom)","20.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0x66);
              }
            }
          }
        }
      }
    }
    KDReports::Report::~Report(&report);
  }
  QFile::~QFile(&file);
  return;
}

Assistant:

void testMargins()
    {
        QFile file(":/margins.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        QVERIFY(report.loadFromXML(&file));
        const QTextDocument &doc = *report.mainTextDocument();
        QCOMPARE(doc.blockCount(), 2);
        QCOMPARE(doc.toPlainText(), QString("Title\nTest used by XmlParser.cpp"));
        qreal top;
        qreal left;
        qreal bottom;
        qreal right;
        report.getMargins(&top, &left, &bottom, &right);
        QCOMPARE(static_cast<double>(top), 40.0);
        QCOMPARE(static_cast<double>(left), 0.0);
        QCOMPARE(static_cast<double>(right), 20.0);
        QCOMPARE(static_cast<double>(bottom), 20.0);
    }